

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::draw2DImage
          (COpenGL3DriverBase *this,ITexture *texture,u32 layer,bool flip)

{
  bool bVar1;
  COpenGL3DriverBase *pCVar2;
  byte in_CL;
  long in_RSI;
  undefined8 in_RDI;
  f32 modificator;
  S3DVertex quad2DVertices [4];
  undefined4 uVar3;
  u32 in_stack_fffffffffffffecc;
  float fVar4;
  COpenGL3DriverBase *in_stack_fffffffffffffed0;
  COpenGL3DriverBase *local_120;
  undefined4 in_stack_fffffffffffffef0;
  SColor in_stack_fffffffffffffef4;
  SColor local_108;
  SColor local_104;
  SColor local_100;
  vector2d<float> local_fc;
  vector2d<float> local_f4;
  vector2d<float> local_ec;
  vector2d<float> local_e4;
  float local_dc;
  vector3d<float> local_d8;
  vector3d<float> local_cc;
  vector3d<float> local_c0;
  _func_int **local_b4;
  float local_ac;
  undefined1 local_a8 [24];
  u32 local_90;
  vector2d<float> local_8c;
  vector3d<float> local_84 [2];
  u32 local_6c;
  vector2d<float> local_68;
  vector3d<float> local_60 [2];
  u32 local_48;
  vector2d<float> local_44;
  vector3d<float> local_3c [2];
  vector2d<float> local_20;
  undefined1 auStack_18 [3];
  byte local_15;
  
  local_15 = in_CL & 1;
  if (in_RSI != 0) {
    chooseMaterial2D(in_stack_fffffffffffffed0);
    bVar1 = setMaterialTexture(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                               (ITexture *)0x360224);
    if (bVar1) {
      setRenderStates2DMode
                ((COpenGL3DriverBase *)
                 CONCAT44(in_stack_fffffffffffffef4.color,in_stack_fffffffffffffef0),
                 SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
                 SUB81((ulong)in_RDI >> 0x28,0));
      pCVar2 = (COpenGL3DriverBase *)local_a8;
      do {
        local_120 = pCVar2;
        S3DVertex::S3DVertex((S3DVertex *)local_120);
        pCVar2 = (COpenGL3DriverBase *)&(local_120->super_CNullDriver).field_0x24;
      } while (pCVar2 != (COpenGL3DriverBase *)auStack_18);
      core::vector3d<float>::vector3d((vector3d<float> *)&local_b4,-1.0,1.0,0.0);
      local_a8._0_8_ = local_b4;
      local_a8._8_4_ = local_ac;
      core::vector3d<float>::vector3d(&local_c0,1.0,1.0,0.0);
      local_84[0].X = local_c0.X;
      local_84[0].Y = local_c0.Y;
      local_84[0].Z = local_c0.Z;
      core::vector3d<float>::vector3d(&local_cc,1.0,-1.0,0.0);
      local_60[0].X = local_cc.X;
      local_60[0].Y = local_cc.Y;
      local_60[0].Z = local_cc.Z;
      core::vector3d<float>::vector3d(&local_d8,-1.0,-1.0,0.0);
      local_3c[0].X = local_d8.X;
      local_3c[0].Y = local_d8.Y;
      local_3c[0].Z = local_d8.Z;
      uVar3 = 0;
      fVar4 = 1.0;
      if ((local_15 & 1) == 0) {
        fVar4 = 0.0;
      }
      local_dc = fVar4;
      core::vector2d<float>::vector2d(&local_e4,0.0,fVar4 + 0.0);
      local_8c = local_e4;
      core::vector2d<float>::vector2d(&local_ec,1.0,local_dc + 0.0);
      local_68 = local_ec;
      core::vector2d<float>::vector2d(&local_f4,1.0,1.0 - local_dc);
      local_44 = local_f4;
      core::vector2d<float>::vector2d(&local_fc,0.0,1.0 - local_dc);
      local_20 = local_fc;
      SColor::SColor(&local_100,0xffffffff);
      local_90 = local_100.color;
      SColor::SColor(&local_104,0xffffffff);
      local_6c = local_104.color;
      SColor::SColor(&local_108,0xffffffff);
      local_48 = local_108.color;
      SColor::SColor((SColor *)&stack0xfffffffffffffef4,0xffffffff);
      drawQuad(local_120,(VertexType *)CONCAT44(fVar4,uVar3),(S3DVertex (*) [4])0x3604b2);
    }
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DImage(const video::ITexture *texture, u32 layer, bool flip)
{
	if (!texture)
		return;

	chooseMaterial2D();
	if (!setMaterialTexture(0, texture))
		return;

	setRenderStates2DMode(false, true, true);

	S3DVertex quad2DVertices[4];

	quad2DVertices[0].Pos = core::vector3df(-1.f, 1.f, 0.f);
	quad2DVertices[1].Pos = core::vector3df(1.f, 1.f, 0.f);
	quad2DVertices[2].Pos = core::vector3df(1.f, -1.f, 0.f);
	quad2DVertices[3].Pos = core::vector3df(-1.f, -1.f, 0.f);

	f32 modificator = (flip) ? 1.f : 0.f;

	quad2DVertices[0].TCoords = core::vector2df(0.f, 0.f + modificator);
	quad2DVertices[1].TCoords = core::vector2df(1.f, 0.f + modificator);
	quad2DVertices[2].TCoords = core::vector2df(1.f, 1.f - modificator);
	quad2DVertices[3].TCoords = core::vector2df(0.f, 1.f - modificator);

	quad2DVertices[0].Color = SColor(0xFFFFFFFF);
	quad2DVertices[1].Color = SColor(0xFFFFFFFF);
	quad2DVertices[2].Color = SColor(0xFFFFFFFF);
	quad2DVertices[3].Color = SColor(0xFFFFFFFF);

	drawQuad(vt2DImage, quad2DVertices);
}